

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifier
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,EncodedCharPtr *pp)

{
  EncodedCharPtr pchMin;
  code *pcVar1;
  bool bVar2;
  tokens tVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000031;
  EncodedCharPtr local_50;
  EncodedCharPtr p;
  undefined4 local_3c;
  codepoint_t local_38;
  bool local_32;
  bool local_31;
  codepoint_t codePoint;
  bool fHasEscape;
  bool fHasMultiChar;
  
  pchMin = *pp;
  local_32 = false;
  local_38 = 0xffffffff;
  local_31 = false;
  p = (EncodedCharPtr)(this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  local_50 = pchMin;
  bVar2 = TryReadCodePoint<true>(this,&local_50,this->m_pchLast,&local_38,&local_32,&local_31);
  tVar3 = tkLastKwd;
  if (bVar2) {
    if (0x10ffff < local_38) {
      local_3c = (undefined4)CONCAT71(in_register_00000031,identifyKwds);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x1a5,"(codePoint < 0x110000u)","codePoint < 0x110000u");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      identifyKwds = SUB41(local_3c,0);
    }
    bVar2 = Js::CharClassifier::IsIdStart(this->charClassifier,local_38);
    if (bVar2) {
      tVar3 = ScanIdentifierContinue(this,identifyKwds,local_32,local_31,pchMin,local_50,pp);
    }
    else {
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = (size_t)p;
    }
  }
  return tVar3;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifier(bool identifyKwds, EncodedCharPtr *pp)
{
    EncodedCharPtr p = *pp;
    EncodedCharPtr pchMin = p;

    // JS6 allows unicode characters in the form of \uxxxx escape sequences
    // to be part of the identifier.
    bool fHasEscape = false;
    bool fHasMultiChar = false;

    codepoint_t codePoint = INVALID_CODEPOINT;
    size_t multiUnitsBeforeLast = this->m_cMultiUnits;

    // Check if we started the id
    if (!TryReadCodePoint<true>(p, m_pchLast, &codePoint, &fHasEscape, &fHasMultiChar))
    {
        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    Assert(codePoint < 0x110000u);
    if (!charClassifier->IsIdStart(codePoint))
    {
        // Put back the last character
        this->RestoreMultiUnits(multiUnitsBeforeLast);

        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    return ScanIdentifierContinue(identifyKwds, fHasEscape, fHasMultiChar, pchMin, p, pp);
}